

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic.c
# Opt level: O0

size_t picnic_signature_size(picnic_params_t param)

{
  picnic_instance_t *ppVar1;
  picnic_params_t in_EDI;
  size_t local_8;
  
  ppVar1 = picnic_instance_get(in_EDI);
  if (ppVar1 == (picnic_instance_t *)0x0) {
    local_8 = 0;
  }
  else {
    switch(in_EDI) {
    case Picnic_L1_FS:
      local_8 = 0x84f0;
      break;
    case Picnic_L1_UR:
      local_8 = 0xd2c9;
      break;
    case Picnic_L3_FS:
      local_8 = 0x12be4;
      break;
    case Picnic_L3_UR:
      local_8 = 0x1dbf5;
      break;
    case Picnic_L5_FS:
      local_8 = 0x206f8;
      break;
    case Picnic_L5_UR:
      local_8 = 0x33262;
      break;
    case Picnic3_L1:
      local_8 = 0x3910;
      break;
    case Picnic3_L3:
      local_8 = 0x88d0;
      break;
    case Picnic3_L5:
      local_8 = 0xee60;
      break;
    case Picnic_L1_full:
      local_8 = 0x7d3d;
      break;
    case Picnic_L3_full:
      local_8 = 0x1160b;
      break;
    case Picnic_L5_full:
      local_8 = 0x1ed4e;
      break;
    default:
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

size_t PICNIC_CALLING_CONVENTION picnic_signature_size(picnic_params_t param) {
  if (!picnic_instance_get(param)) {
    return 0;
  }

  switch (param) {
  case Picnic_L1_FS:
    return PICNIC_SIGNATURE_SIZE_Picnic_L1_FS;
  case Picnic_L1_UR:
    return PICNIC_SIGNATURE_SIZE_Picnic_L1_UR;
  case Picnic_L1_full:
    return PICNIC_SIGNATURE_SIZE_Picnic_L1_full;
  case Picnic3_L1:
    return PICNIC_SIGNATURE_SIZE_Picnic3_L1;
  case Picnic_L3_FS:
    return PICNIC_SIGNATURE_SIZE_Picnic_L3_FS;
  case Picnic_L3_UR:
    return PICNIC_SIGNATURE_SIZE_Picnic_L3_UR;
  case Picnic_L3_full:
    return PICNIC_SIGNATURE_SIZE_Picnic_L3_full;
  case Picnic3_L3:
    return PICNIC_SIGNATURE_SIZE_Picnic3_L3;
  case Picnic_L5_FS:
    return PICNIC_SIGNATURE_SIZE_Picnic_L5_FS;
  case Picnic_L5_UR:
    return PICNIC_SIGNATURE_SIZE_Picnic_L5_UR;
  case Picnic_L5_full:
    return PICNIC_SIGNATURE_SIZE_Picnic_L5_full;
  case Picnic3_L5:
    return PICNIC_SIGNATURE_SIZE_Picnic3_L5;
  default:
    /* this should never happen */
    return 0;
  }
}